

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2ece268::PeerManagerImpl::UpdatedBlockTip
          (PeerManagerImpl *this,CBlockIndex *pindexNew,CBlockIndex *pindexFork,
          bool fInitialDownload)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  uint256 *puVar3;
  _Base_ptr p_Var4;
  iterator __position;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer puVar8;
  _Base_ptr p_Var9;
  undefined7 in_register_00000009;
  uint256 *hash;
  uint256 *__args;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> vHashes;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock45;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock44;
  vector<uint256,_std::allocator<uint256>_> local_88;
  unique_lock<std::mutex> local_68;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = pindexNew->nTime;
  LOCK();
  (this->m_best_height).super___atomic_base<int>._M_i = pindexNew->nHeight;
  UNLOCK();
  LOCK();
  (this->m_best_block_time)._M_i.__r = (ulong)uVar2;
  UNLOCK();
  if ((int)CONCAT71(in_register_00000009,fInitialDownload) == 0) {
    local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_start = (uint256 *)0x0;
    local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_finish = (uint256 *)0x0;
    local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (uint256 *)0x0;
    do {
      if (pindexNew == pindexFork) break;
      puVar3 = pindexNew->phashBlock;
      if (puVar3 == (uint256 *)0x0) {
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      local_58.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
      local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
      local_58.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
      local_58.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
      if (local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_58);
      }
      else {
        uVar5 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
        uVar6 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
        uVar7 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
        *(undefined8 *)
         (((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
             *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
        *(undefined8 *)
         (((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
             uVar7;
        *(undefined8 *)
         ((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar5;
        *(undefined8 *)
         (((local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) = uVar6;
        local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pindexNew = pindexNew->pprev;
    } while ((long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start != 0x100);
    local_58.super_base_blob<256U>.m_data._M_elems._0_8_ = &this->m_peer_mutex;
    local_58.super_base_blob<256U>.m_data._M_elems._8_8_ =
         local_58.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_58);
    p_Var9 = (this->m_peer_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->m_peer_map)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        p_Var4 = p_Var9[1]._M_parent;
        local_68._M_device = (mutex_type *)&p_Var4[2]._M_left;
        local_68._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_68);
        puVar8 = local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start) {
          puVar3 = local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          do {
            __args = puVar3 + -1;
            __position._M_current = (uint256 *)p_Var4[4]._M_right;
            if (__position._M_current == *(uint256 **)(p_Var4 + 5)) {
              std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                        ((vector<uint256,std::allocator<uint256>> *)&p_Var4[4]._M_left,__position,
                         __args);
            }
            else {
              uVar5 = *(undefined8 *)(__args->super_base_blob<256U>).m_data._M_elems;
              uVar6 = *(undefined8 *)(puVar3[-1].super_base_blob<256U>.m_data._M_elems + 8);
              uVar7 = *(undefined8 *)(puVar3[-1].super_base_blob<256U>.m_data._M_elems + 0x18);
              *(undefined8 *)
               (((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x10) =
                   *(undefined8 *)(puVar3[-1].super_base_blob<256U>.m_data._M_elems + 0x10);
              *(undefined8 *)
               (((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar7;
              *(undefined8 *)((__position._M_current)->super_base_blob<256U>).m_data._M_elems =
                   uVar5;
              *(undefined8 *)(((__position._M_current)->super_base_blob<256U>).m_data._M_elems + 8)
                   = uVar6;
              p_Var4[4]._M_right = p_Var4[4]._M_right + 1;
            }
            puVar3 = __args;
          } while (__args != puVar8);
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_68);
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_58);
    CConnman::WakeMessageHandler(this->m_connman);
    if (local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (uint256 *)0x0) {
      operator_delete(local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::UpdatedBlockTip(const CBlockIndex *pindexNew, const CBlockIndex *pindexFork, bool fInitialDownload)
{
    SetBestBlock(pindexNew->nHeight, std::chrono::seconds{pindexNew->GetBlockTime()});

    // Don't relay inventory during initial block download.
    if (fInitialDownload) return;

    // Find the hashes of all blocks that weren't previously in the best chain.
    std::vector<uint256> vHashes;
    const CBlockIndex *pindexToAnnounce = pindexNew;
    while (pindexToAnnounce != pindexFork) {
        vHashes.push_back(pindexToAnnounce->GetBlockHash());
        pindexToAnnounce = pindexToAnnounce->pprev;
        if (vHashes.size() == MAX_BLOCKS_TO_ANNOUNCE) {
            // Limit announcements in case of a huge reorganization.
            // Rely on the peer's synchronization mechanism in that case.
            break;
        }
    }

    {
        LOCK(m_peer_mutex);
        for (auto& it : m_peer_map) {
            Peer& peer = *it.second;
            LOCK(peer.m_block_inv_mutex);
            for (const uint256& hash : vHashes | std::views::reverse) {
                peer.m_blocks_for_headers_relay.push_back(hash);
            }
        }
    }

    m_connman.WakeMessageHandler();
}